

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::SizeAtCapacity(RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  uint uVar3;
  
  iVar1 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar2 = rep(this);
    uVar3 = pRVar2->allocated_size;
  }
  if ((int)uVar3 < iVar1) {
    SizeAtCapacity();
  }
  else {
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar2 = rep(this);
      uVar3 = pRVar2->allocated_size;
    }
    if ((int)uVar3 <= this->capacity_proxy_ + 1) {
      return this->capacity_proxy_ < this->current_size_;
    }
  }
  SizeAtCapacity();
}

Assistant:

inline bool SizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This is equivalent to `current_size_ == Capacity()`.
    // Assuming `Capacity()` function is inlined, compiler is likely to optimize
    // away "+ kSSOCapacity" and reduce it to "current_size_ > capacity_proxy_"
    // which is an instruction less than "current_size_ == capacity_proxy_ + 1".
    return current_size_ >= Capacity();
  }